

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlReaderNewWalker(xmlTextReaderPtr reader,xmlDocPtr doc)

{
  xmlDictPtr pxVar1;
  int iVar2;
  
  iVar2 = -1;
  if (reader != (xmlTextReaderPtr)0x0 && doc != (xmlDocPtr)0x0) {
    if (reader->input != (xmlParserInputBufferPtr)0x0) {
      xmlFreeParserInputBuffer(reader->input);
    }
    if (reader->ctxt != (xmlParserCtxtPtr)0x0) {
      xmlCtxtReset(reader->ctxt);
    }
    iVar2 = 0;
    reader->entNr = 0;
    reader->input = (xmlParserInputBufferPtr)0x0;
    reader->mode = 0;
    reader->base = 0;
    reader->cur = 0;
    reader->node = (xmlNodePtr)0x0;
    reader->curnode = (xmlNodePtr)0x0;
    reader->allocs = 2;
    reader->state = XML_TEXTREADER_START;
    reader->doc = doc;
    if (reader->dict == (xmlDictPtr)0x0) {
      if ((reader->ctxt == (xmlParserCtxtPtr)0x0) ||
         (pxVar1 = reader->ctxt->dict, pxVar1 == (xmlDictPtr)0x0)) {
        pxVar1 = xmlDictCreate();
      }
      reader->dict = pxVar1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlReaderNewWalker(xmlTextReaderPtr reader, xmlDocPtr doc)
{
    if (doc == NULL)
        return (-1);
    if (reader == NULL)
        return (-1);

    if (reader->input != NULL) {
        xmlFreeParserInputBuffer(reader->input);
    }
    if (reader->ctxt != NULL) {
	xmlCtxtReset(reader->ctxt);
    }

    reader->entNr = 0;
    reader->input = NULL;
    reader->mode = XML_TEXTREADER_MODE_INITIAL;
    reader->node = NULL;
    reader->curnode = NULL;
    reader->base = 0;
    reader->cur = 0;
    reader->allocs = XML_TEXTREADER_CTXT;
    reader->doc = doc;
    reader->state = XML_TEXTREADER_START;
    if (reader->dict == NULL) {
        if ((reader->ctxt != NULL) && (reader->ctxt->dict != NULL))
	    reader->dict = reader->ctxt->dict;
	else
	    reader->dict = xmlDictCreate();
    }
    return(0);
}